

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

_Bool read_blob(BinarySource *src,int nlines,BinarySink *bs)

{
  int iVar1;
  char *ptr;
  char *__s;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uchar decoded [3];
  uchar local_4b [3];
  long local_48;
  BinarySource *local_40;
  ulong local_38;
  
  local_40 = src;
  if (0x1554 < nlines) {
    __assert_fail("nlines < MAX_KEY_BLOB_LINES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x20d,"_Bool read_blob(BinarySource *, int, BinarySink *)");
  }
  uVar6 = 0;
  ptr = (char *)safemalloc((ulong)(uint)(nlines * 0x30),1,0);
  if (nlines < 1) {
    lVar4 = 1;
  }
  else {
    lVar4 = 0;
    while (local_38 = uVar6, __s = read_body(local_40), __s != (char *)0x0) {
      sVar2 = strlen(__s);
      iVar7 = (int)sVar2;
      if ((0x40 < iVar7) || ((sVar2 & 3) != 0)) {
        safefree(ptr);
        ptr = __s;
        break;
      }
      local_48 = lVar4;
      if (0 < iVar7) {
        lVar4 = 0;
        do {
          iVar1 = base64_decode_atom(__s + lVar4,local_4b);
          if (iVar1 == 0) {
            safefree(__s);
            safefree(ptr);
            bVar3 = (byte)local_48;
            goto LAB_001156a3;
          }
          BinarySink_put_data(bs->binarysink_,local_4b,(long)iVar1);
          lVar4 = lVar4 + 4;
        } while ((int)lVar4 < iVar7);
      }
      safefree(__s);
      uVar5 = (int)local_38 + 1;
      uVar6 = (ulong)uVar5;
      lVar4 = CONCAT71((int7)((ulong)lVar4 >> 8),nlines <= (int)uVar5);
      if (uVar5 == nlines) break;
    }
  }
  bVar3 = (byte)lVar4;
  safefree(ptr);
LAB_001156a3:
  return (_Bool)(bVar3 & 1);
}

Assistant:

static bool read_blob(BinarySource *src, int nlines, BinarySink *bs)
{
    unsigned char *blob;
    char *line;
    int linelen;
    int i, j, k;

    /* We expect at most 64 base64 characters, ie 48 real bytes, per line. */
    assert(nlines < MAX_KEY_BLOB_LINES);
    blob = snewn(48 * nlines, unsigned char);

    for (i = 0; i < nlines; i++) {
        line = read_body(src);
        if (!line) {
            sfree(blob);
            return false;
        }
        linelen = strlen(line);
        if (linelen % 4 != 0 || linelen > 64) {
            sfree(blob);
            sfree(line);
            return false;
        }
        for (j = 0; j < linelen; j += 4) {
            unsigned char decoded[3];
            k = base64_decode_atom(line + j, decoded);
            if (!k) {
                sfree(line);
                sfree(blob);
                return false;
            }
            put_data(bs, decoded, k);
        }
        sfree(line);
    }
    sfree(blob);
    return true;
}